

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O3

pair<tsl::detail_robin_hash::robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
 __thiscall
tsl::detail_robin_hash::
robin_hash<unsigned_long,tsl::robin_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>
::insert_impl<unsigned_long,unsigned_long_const&>
          (robin_hash<unsigned_long,tsl::robin_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,void,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>,false,tsl::rh::power_of_two_growth_policy<2ul>>
           *this,unsigned_long *key,unsigned_long *value_type_args)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  robin_iterator<false> rVar4;
  long lVar5;
  unsigned_long extraout_RDX;
  unsigned_long uVar6;
  undefined8 uVar7;
  short curr_dist_from_ideal_bucket;
  ulong ibucket;
  pair<tsl::detail_robin_hash::robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar8;
  value_type_conflict1 value;
  unsigned_long local_38;
  
  uVar1 = *key;
  lVar5 = *(long *)(this + 0x20);
  ibucket = uVar1 & *(ulong *)this;
  lVar3 = ibucket * 0x10;
  if (*(short *)(lVar5 + lVar3) < 0) goto LAB_0016e3e2;
  curr_dist_from_ideal_bucket = 0;
  do {
    rVar4.m_bucket = (bucket_entry_ptr)(lVar3 + lVar5);
    if (*(ulong *)(rVar4.m_bucket)->m_value == uVar1) {
      uVar7 = 0;
      goto LAB_0016e471;
    }
    curr_dist_from_ideal_bucket = curr_dist_from_ideal_bucket + 1;
    ibucket = ibucket + 1 & *(ulong *)this;
    lVar3 = ibucket * 0x10;
  } while (curr_dist_from_ideal_bucket <= *(short *)(lVar5 + lVar3));
  while (bVar2 = robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 ::rehash_on_extreme_load
                           ((robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                             *)this,curr_dist_from_ideal_bucket), bVar2) {
    ibucket = uVar1 & *(ulong *)this;
    if (*(short *)(*(long *)(this + 0x20) + ibucket * 0x10) < 0) {
LAB_0016e3e2:
      curr_dist_from_ideal_bucket = 0;
    }
    else {
      curr_dist_from_ideal_bucket = 0;
      do {
        curr_dist_from_ideal_bucket = curr_dist_from_ideal_bucket + 1;
        ibucket = ibucket + 1 & *(ulong *)this;
      } while (curr_dist_from_ideal_bucket <= *(short *)(*(long *)(this + 0x20) + ibucket * 0x10));
    }
  }
  lVar5 = *(long *)(this + 0x20);
  lVar3 = ibucket * 0x10;
  if (*(short *)(lVar5 + lVar3) == -1) {
    uVar6 = *value_type_args;
    *(unsigned_long *)((distance_type *)(lVar5 + lVar3) + 4) = uVar6;
    *(distance_type *)(lVar5 + lVar3) = curr_dist_from_ideal_bucket;
  }
  else {
    local_38 = *value_type_args;
    robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
    ::insert_value_impl((robin_hash<unsigned_long,_tsl::robin_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_void,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                         *)this,ibucket,curr_dist_from_ideal_bucket,(truncated_hash_type)uVar1,
                        &local_38);
    lVar5 = *(long *)(this + 0x20);
    uVar6 = extraout_RDX;
  }
  *(long *)(this + 0x30) = *(long *)(this + 0x30) + 1;
  rVar4.m_bucket = (bucket_entry_ptr)(lVar5 + lVar3);
  uVar7 = CONCAT71((int7)(uVar6 >> 8),1);
LAB_0016e471:
  pVar8._8_8_ = uVar7;
  pVar8.first.m_bucket = rVar4.m_bucket;
  return pVar8;
}

Assistant:

std::pair<iterator, bool> insert_impl(const K& key,
                                        Args&&... value_type_args) {
    const std::size_t hash = hash_key(key);

    std::size_t ibucket = bucket_for_hash(hash);
    distance_type dist_from_ideal_bucket = 0;

    while (dist_from_ideal_bucket <=
           m_buckets[ibucket].dist_from_ideal_bucket()) {
      if ((!USE_STORED_HASH_ON_LOOKUP ||
           m_buckets[ibucket].bucket_hash_equal(hash)) &&
          compare_keys(KeySelect()(m_buckets[ibucket].value()), key)) {
        return std::make_pair(iterator(m_buckets + ibucket), false);
      }

      ibucket = next_bucket(ibucket);
      dist_from_ideal_bucket++;
    }

    while (rehash_on_extreme_load(dist_from_ideal_bucket)) {
      ibucket = bucket_for_hash(hash);
      dist_from_ideal_bucket = 0;

      while (dist_from_ideal_bucket <=
             m_buckets[ibucket].dist_from_ideal_bucket()) {
        ibucket = next_bucket(ibucket);
        dist_from_ideal_bucket++;
      }
    }

    if (m_buckets[ibucket].empty()) {
      m_buckets[ibucket].set_value_of_empty_bucket(
          dist_from_ideal_bucket, bucket_entry::truncate_hash(hash),
          std::forward<Args>(value_type_args)...);
    } else {
      insert_value(ibucket, dist_from_ideal_bucket,
                   bucket_entry::truncate_hash(hash),
                   std::forward<Args>(value_type_args)...);
    }

    m_nb_elements++;
    /*
     * The value will be inserted in ibucket in any case, either because it was
     * empty or by stealing the bucket (robin hood).
     */
    return std::make_pair(iterator(m_buckets + ibucket), true);
  }